

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getclosureroot(HSQUIRRELVM v,SQInteger idx)

{
  SQInteger this;
  SQObjectPtr local_38;
  SQObjectPtr *local_28;
  SQObjectPtr *c;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  c = (SQObjectPtr *)idx;
  idx_local = (SQInteger)v;
  local_28 = stack_get(v,idx);
  this = idx_local;
  if ((local_28->super_SQObject)._type == OT_CLOSURE) {
    SQObjectPtr::SQObjectPtr(&local_38,&((local_28->super_SQObject)._unVal.pClosure)->_root->_obj);
    SQVM::Push((SQVM *)this,&local_38);
    SQObjectPtr::~SQObjectPtr(&local_38);
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)idx_local,"closure expected");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_getclosureroot(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &c = stack_get(v,idx);
    if(!sq_isclosure(c)) return sq_throwerror(v, _SC("closure expected"));
    v->Push(_closure(c)->_root->_obj);
    return SQ_OK;
}